

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O3

size_t release_unused_segments(mstate m)

{
  malloc_segment *pmVar1;
  char *pcVar2;
  ulong uVar3;
  size_t __len;
  malloc_tree_chunk *pmVar4;
  long lVar5;
  char *pcVar6;
  tbinptr pmVar7;
  malloc_tree_chunk **ppmVar8;
  int iVar9;
  uint uVar10;
  malloc_tree_chunk *pmVar11;
  uint uVar12;
  tbinptr pmVar13;
  ulong uVar14;
  tbinptr pmVar15;
  byte bVar16;
  malloc_tree_chunk **ppmVar17;
  long lVar18;
  malloc_segment *pmVar19;
  malloc_segment *pmVar20;
  uint uVar21;
  size_t local_48;
  
  if (_gm_.seg.next == (malloc_segment *)0x0) {
    uVar21 = 0;
    local_48 = 0;
  }
  else {
    local_48 = 0;
    uVar21 = 0;
    pmVar19 = &_gm_.seg;
    pmVar20 = _gm_.seg.next;
    do {
      pmVar1 = pmVar20->next;
      if ((pmVar20->sflags & 9) == 1) {
        pcVar2 = pmVar20->base;
        uVar14 = (ulong)(-(int)pcVar2 - 0x10U & 0xf);
        uVar3 = *(ulong *)(pcVar2 + uVar14 + 8);
        if (((uint)uVar3 & 3) == 1) {
          __len = pmVar20->size;
          pmVar15 = (tbinptr)(pcVar2 + uVar14);
          uVar14 = uVar3 & 0xfffffffffffffff8;
          if (pcVar2 + (__len - 0x50) <= (char *)((long)&pmVar15->prev_foot + uVar14)) {
            if (pmVar15 == (tbinptr)_gm_.dv) {
              _gm_.dv = (mchunkptr)0x0;
              _gm_.dvsize = 0;
            }
            else {
              pmVar13 = pmVar15->bk;
              pmVar11 = pmVar15->parent;
              if (pmVar13 == pmVar15) {
                if (pmVar15->child[1] == (tbinptr)0x0) {
                  if (pmVar15->child[0] == (tbinptr)0x0) {
                    pmVar13 = (tbinptr)0x0;
                    goto LAB_00104fa9;
                  }
                  pmVar7 = pmVar15->child[0];
                  ppmVar8 = pmVar15->child;
                }
                else {
                  pmVar7 = pmVar15->child[1];
                  ppmVar8 = pmVar15->child + 1;
                }
                do {
                  do {
                    ppmVar17 = ppmVar8;
                    pmVar13 = pmVar7;
                    pmVar7 = pmVar13->child[1];
                    ppmVar8 = pmVar13->child + 1;
                  } while (pmVar13->child[1] != (malloc_tree_chunk *)0x0);
                  pmVar7 = pmVar13->child[0];
                  ppmVar8 = pmVar13->child;
                } while (pmVar13->child[0] != (malloc_tree_chunk *)0x0);
                if (ppmVar17 < _gm_.least_addr) goto LAB_001051d8;
                *ppmVar17 = (malloc_tree_chunk *)0x0;
              }
              else {
                pmVar4 = pmVar15->fd;
                if (((pmVar4 < _gm_.least_addr) || (pmVar4->bk != pmVar15)) ||
                   (pmVar13->fd != pmVar15)) goto LAB_001051d8;
                pmVar4->bk = pmVar13;
                pmVar13->fd = pmVar4;
              }
LAB_00104fa9:
              if (pmVar11 != (malloc_tree_chunk *)0x0) {
                uVar10 = pmVar15->index;
                if (pmVar15 == _gm_.treebins[uVar10]) {
                  _gm_.treebins[uVar10] = pmVar13;
                  if (pmVar13 == (tbinptr)0x0) {
                    bVar16 = (byte)uVar10 & 0x1f;
                    _gm_.treemap = _gm_.treemap & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
                  }
                  else {
LAB_00104fee:
                    pcVar6 = _gm_.least_addr;
                    if (pmVar13 < _gm_.least_addr) goto LAB_001051d8;
                    pmVar13->parent = pmVar11;
                    pmVar11 = pmVar15->child[0];
                    if (pmVar11 != (malloc_tree_chunk *)0x0) {
                      if (pmVar11 < pcVar6) goto LAB_001051d8;
                      pmVar13->child[0] = pmVar11;
                      pmVar11->parent = pmVar13;
                    }
                    pmVar11 = pmVar15->child[1];
                    if (pmVar11 != (malloc_tree_chunk *)0x0) {
                      if (pmVar11 < pcVar6) goto LAB_001051d8;
                      pmVar13->child[1] = pmVar11;
                      pmVar11->parent = pmVar13;
                    }
                  }
                }
                else {
                  if (pmVar11 < _gm_.least_addr) goto LAB_001051d8;
                  pmVar11->child[pmVar11->child[0] != pmVar15] = pmVar13;
                  if (pmVar13 != (tbinptr)0x0) goto LAB_00104fee;
                }
              }
            }
            iVar9 = munmap(pcVar2,__len);
            if (iVar9 == 0) {
              local_48 = local_48 + __len;
              _gm_.footprint = _gm_.footprint - __len;
              pmVar19->next = pmVar1;
              pmVar20 = pmVar19;
            }
            else {
              uVar10 = (uint)(uVar3 >> 8);
              if (uVar10 == 0) {
                uVar12 = 0;
              }
              else {
                uVar12 = 0x1f;
                if (uVar10 < 0x10000) {
                  uVar12 = 0x1f;
                  if (uVar10 != 0) {
                    for (; uVar10 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                    }
                  }
                  uVar12 = (uint)((uVar14 >> ((ulong)(byte)(0x26 - (char)(uVar12 ^ 0x1f)) & 0x3f) &
                                  1) != 0) + (uVar12 ^ 0x1f) * 2 ^ 0x3e;
                }
              }
              pmVar11 = (malloc_tree_chunk *)(_gm_.treebins + uVar12);
              pmVar15->index = uVar12;
              pmVar15->child[0] = (malloc_tree_chunk *)0x0;
              pmVar15->child[1] = (malloc_tree_chunk *)0x0;
              if ((_gm_.treemap >> (uVar12 & 0x1f) & 1) == 0) {
                _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar12 & 0x1f);
                pmVar11->prev_foot = (size_t)pmVar15;
              }
              else {
                bVar16 = 0x39 - (char)(uVar12 >> 1);
                if (uVar12 == 0x1f) {
                  bVar16 = 0;
                }
                lVar18 = uVar14 << (bVar16 & 0x3f);
                pmVar4 = (malloc_tree_chunk *)pmVar11->prev_foot;
                do {
                  pmVar11 = pmVar4;
                  if ((pmVar11->head & 0xfffffffffffffff8) == uVar14) {
                    if ((pmVar11 < _gm_.least_addr) ||
                       (pmVar4 = pmVar11->fd, pmVar4 < _gm_.least_addr)) goto LAB_001051d8;
                    pmVar4->bk = pmVar15;
                    pmVar11->fd = pmVar15;
                    pmVar15->fd = pmVar4;
                    pmVar15->bk = pmVar11;
                    pmVar15->parent = (malloc_tree_chunk *)0x0;
                    goto LAB_0010518e;
                  }
                  lVar5 = lVar18 >> 0x3f;
                  lVar18 = lVar18 * 2;
                  pmVar4 = *(malloc_tree_chunk **)((long)pmVar11 + lVar5 * -8 + 0x20);
                } while (pmVar4 != (malloc_tree_chunk *)0x0);
                pcVar2 = (char *)((long)pmVar11 + lVar5 * -8 + 0x20);
                if (pcVar2 < _gm_.least_addr) {
LAB_001051d8:
                  abort();
                }
                *(tbinptr *)pcVar2 = pmVar15;
              }
              pmVar15->parent = pmVar11;
              pmVar15->bk = pmVar15;
              pmVar15->fd = pmVar15;
            }
          }
        }
      }
LAB_0010518e:
      uVar21 = uVar21 + 1;
      pmVar19 = pmVar20;
      pmVar20 = pmVar1;
    } while (pmVar1 != (malloc_segment *)0x0);
  }
  _gm_.release_checks = 0xfff;
  if (0xfff < uVar21) {
    _gm_.release_checks = (size_t)uVar21;
  }
  return local_48;
}

Assistant:

static size_t release_unused_segments(mstate m) {
  size_t released = 0;
  int nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char* base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    ++nsegs;
    if (is_mmapped_segment(sp) && !is_extern_segment(sp)) {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!is_inuse(p) && (char*)p + psize >= base + size - TOP_FOOT_SIZE) {
        tchunkptr tp = (tchunkptr)p;
        assert(segment_holds(sp, (char*)sp));
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        else {
          unlink_large_chunk(m, tp);
        }
        if (CALL_MUNMAP(base, size) == 0) {
          released += size;
          m->footprint -= size;
          /* unlink obsoleted record */
          sp = pred;
          sp->next = next;
        }
        else { /* back out if cannot unmap */
          insert_large_chunk(m, tp, psize);
        }
      }
    }
    if (NO_SEGMENT_TRAVERSAL) /* scan only first segment */
      break;
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = (((size_t) nsegs > (size_t) MAX_RELEASE_CHECK_RATE)?
                       (size_t) nsegs : (size_t) MAX_RELEASE_CHECK_RATE);
  return released;
}